

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void findTextureWidgetsRecursively
               (QWidget *tlw,QWidget *widget,QPlatformTextureList *widgetTextures,
               QList<QWidget_*> *nativeChildren)

{
  QWidgetPrivate *this;
  QWidget *widget_00;
  bool bVar1;
  undefined4 uVar2;
  QPoint QVar3;
  QSize QVar4;
  int i;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QRect local_58;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = *(QWidgetPrivate **)&widget->field_0x8;
  if ((this->field_0x253 & 1) != 0) {
    uVar2 = (**(code **)(*(long *)this + 0x50))(this);
    auVar6._8_8_ = 0;
    auVar6._0_4_ = local_58.x2.m_i;
    auVar6._4_4_ = local_58.y2.m_i;
    local_58 = (QRect)(auVar6 << 0x40);
    QVar3 = QWidget::mapTo(widget,tlw,(QPoint *)&local_58);
    QVar4 = QWidget::size(widget);
    local_48 = (int)QVar3.xp.m_i;
    local_40 = QVar4.wd.m_i.m_i + local_48 + -1;
    local_44 = (int)QVar3.yp.m_i;
    local_3c = local_44 + -1 + QVar4.ht.m_i.m_i;
    auVar6 = (**(code **)(*(long *)this + 0x48))(this);
    local_58 = QWidgetPrivate::clipRect(this);
    QPlatformTextureList::appendTexture
              (widgetTextures,widget,auVar6._0_8_,auVar6._8_8_,&local_48,&local_58,uVar2);
  }
  for (uVar5 = 0; uVar5 < *(ulong *)&this->field_0x28; uVar5 = uVar5 + 1) {
    widget_00 = *(QWidget **)(*(long *)&this->field_0x20 + uVar5 * 8);
    if ((widget_00 != (QWidget *)0x0) &&
       ((*(byte *)(*(long *)&widget_00->field_0x8 + 0x30) & 1) != 0)) {
      if (((widget_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        bVar1 = hasPlatformWindow(widget_00);
        if (bVar1) {
          QList<QWidget_*>::append(nativeChildren,widget_00);
        }
      }
      if (((widget_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        bVar1 = hasPlatformWindow(widget_00);
        if (((!bVar1) && ((widget_00->data->widget_attributes & 0x10000) == 0)) &&
           ((*(byte *)(*(long *)&widget_00->field_0x8 + 0x253) & 2) != 0)) {
          findTextureWidgetsRecursively(tlw,widget_00,widgetTextures,nativeChildren);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void findTextureWidgetsRecursively(QWidget *tlw, QWidget *widget,
                                          QPlatformTextureList *widgetTextures,
                                          QList<QWidget *> *nativeChildren)
{
    QWidgetPrivate *wd = QWidgetPrivate::get(widget);
    if (wd->renderToTexture) {
        QPlatformTextureList::Flags flags = wd->textureListFlags();
        const QRect rect(widget->mapTo(tlw, QPoint()), widget->size());
        QWidgetPrivate::TextureData data = wd->texture();
        widgetTextures->appendTexture(widget, data.textureLeft, data.textureRight, rect, wd->clipRect(), flags);
    }

    for (int i = 0; i < wd->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(wd->children.at(i));
        // Stop at native widgets but store them. Stop at hidden widgets too.
        if (w && !w->isWindow() && hasPlatformWindow(w))
            nativeChildren->append(w);
        if (w && !w->isWindow() && !hasPlatformWindow(w) && !w->isHidden() && QWidgetPrivate::get(w)->textureChildSeen)
            findTextureWidgetsRecursively(tlw, w, widgetTextures, nativeChildren);
    }
}